

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractLoggingDevice.cpp
# Opt level: O2

void __thiscall
SLogLib::AbstractLoggingDevicePriv::~AbstractLoggingDevicePriv(AbstractLoggingDevicePriv *this)

{
  if (this->mFormatter != (AbstractFormatter *)0x0) {
    (**(code **)(*(long *)this->mFormatter + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->mBufferedMessages);
  std::__cxx11::string::~string((string *)&this->mName);
  return;
}

Assistant:

~AbstractLoggingDevicePriv()
	{
		delete mFormatter;
	}